

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_array_add_dimension(parser_info *info)

{
  node_info *pnVar1;
  int iVar2;
  
  pnVar1 = info->node;
  if (((coda_expression *)pnVar1->data == (coda_expression *)0x0) && (pnVar1->empty == 0)) {
    iVar2 = coda_type_array_add_fixed_dimension
                      ((coda_type_array *)pnVar1->parent->data,pnVar1->integer_data);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    iVar2 = coda_type_array_add_variable_dimension
                      ((coda_type_array *)pnVar1->parent->data,(coda_expression *)pnVar1->data);
    if (iVar2 != 0) {
      return -1;
    }
    info->node->data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int cd_array_add_dimension(parser_info *info)
{
    if (info->node->data != NULL || info->node->empty)
    {
        if (coda_type_array_add_variable_dimension((coda_type_array *)info->node->parent->data,
                                                   (coda_expression *)info->node->data) != 0)
        {
            return -1;
        }
        info->node->data = NULL;
    }
    else
    {
        if (coda_type_array_add_fixed_dimension((coda_type_array *)info->node->parent->data,
                                                (long)info->node->integer_data) != 0)
        {
            return -1;
        }
    }
    return 0;
}